

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

bool __thiscall svg::Document::save(Document *this)

{
  int iVar1;
  string sStack_238;
  ofstream ofs;
  int aiStack_1f8 [120];
  
  std::ofstream::ofstream(&ofs,(this->file_name)._M_dataplus._M_p,_S_out);
  iVar1 = *(int *)((long)aiStack_1f8 + *(long *)(_ofs + -0x18));
  if (iVar1 == 0) {
    toString_abi_cxx11_(&sStack_238,this);
    std::operator<<((ostream *)&ofs,(string *)&sStack_238);
    std::__cxx11::string::~string((string *)&sStack_238);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&ofs);
  return iVar1 == 0;
}

Assistant:

bool save() const
        {
            std::ofstream ofs(file_name.c_str());
            if (!ofs.good())
                return false;

            ofs << toString();
            ofs.close();
            return true;
        }